

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O1

void cali_begin_region(char *name)

{
  size_t sVar1;
  Caliper c;
  Variant local_40;
  Caliper local_30;
  
  cali::Caliper::Caliper(&local_30);
  sVar1 = strlen(name);
  local_40.m_v.type_and_size =
       (sVar1 << 0x20) +
       (ulong)(((uint)(byte)name[sVar1 - 1] |
               (uint)(byte)name[sVar1 >> 1] << 8 | (uint)(byte)*name << 0x10) << 8) + 4;
  local_40.m_v.value = (anon_union_8_7_33918203_for_value)name;
  cali::Caliper::begin(&local_30,(Attribute *)&cali::region_attr,&local_40);
  return;
}

Assistant:

void cali_begin_region(const char* name)
{
    Caliper c;
    c.begin(cali::region_attr, Variant(name));
}